

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sphere.cpp
# Opt level: O0

int __thiscall ON_Sphere::GetNurbForm(ON_Sphere *this,ON_NurbsSurface *s)

{
  double *pdVar1;
  bool bVar2;
  double *pdVar3;
  int iVar4;
  double dVar5;
  ON_3dPoint local_260;
  ON_3dPoint local_248;
  ON_3dPoint local_230;
  undefined1 local_218 [8];
  ON_4dPoint northpole;
  undefined1 local_1e0 [8];
  ON_4dPoint southpole;
  double dStack_1b8;
  int i;
  double w13;
  double w;
  ON_3dPoint local_190;
  ON_3dPoint local_178;
  ON_3dPoint local_160;
  undefined1 local_148 [8];
  ON_3dPoint p [9];
  ON_3dVector z;
  ON_3dVector y;
  ON_3dVector x;
  ON_4dPoint *CV;
  int rc;
  ON_NurbsSurface *s_local;
  ON_Sphere *this_local;
  
  CV._4_4_ = 0;
  bVar2 = IsValid(this);
  if (bVar2) {
    ON_NurbsSurface::Create(s,3,true,3,3,9,5);
    s->m_knot[0][1] = 0.0;
    *s->m_knot[0] = 0.0;
    s->m_knot[0][3] = 1.5707963267948966;
    s->m_knot[0][2] = 1.5707963267948966;
    s->m_knot[0][5] = 3.141592653589793;
    s->m_knot[0][4] = 3.141592653589793;
    s->m_knot[0][7] = 4.71238898038469;
    s->m_knot[0][6] = 4.71238898038469;
    s->m_knot[0][9] = 6.283185307179586;
    s->m_knot[0][8] = 6.283185307179586;
    s->m_knot[1][1] = -1.5707963267948966;
    *s->m_knot[1] = -1.5707963267948966;
    s->m_knot[1][3] = 0.0;
    s->m_knot[1][2] = 0.0;
    s->m_knot[1][5] = 1.5707963267948966;
    s->m_knot[1][4] = 1.5707963267948966;
    pdVar1 = s->m_cv;
    ::operator*((ON_3dVector *)&y.z,this->radius,&(this->plane).xaxis);
    ::operator*((ON_3dVector *)&z.z,this->radius,&(this->plane).yaxis);
    ::operator*((ON_3dVector *)&p[8].z,this->radius,&(this->plane).zaxis);
    ON_3dPoint::operator+((ON_3dPoint *)local_148,(ON_3dPoint *)this,(ON_3dVector *)&y.z);
    ON_3dPoint::operator+(&local_160,(ON_3dPoint *)this,(ON_3dVector *)&y.z);
    ON_3dPoint::operator+((ON_3dPoint *)&p[0].z,&local_160,(ON_3dVector *)&z.z);
    ON_3dPoint::operator+((ON_3dPoint *)&p[1].z,(ON_3dPoint *)this,(ON_3dVector *)&z.z);
    ON_3dPoint::operator-(&local_178,(ON_3dPoint *)this,(ON_3dVector *)&y.z);
    ON_3dPoint::operator+((ON_3dPoint *)&p[2].z,&local_178,(ON_3dVector *)&z.z);
    ON_3dPoint::operator-((ON_3dPoint *)&p[3].z,(ON_3dPoint *)this,(ON_3dVector *)&y.z);
    ON_3dPoint::operator-(&local_190,(ON_3dPoint *)this,(ON_3dVector *)&y.z);
    ON_3dPoint::operator-((ON_3dPoint *)&p[4].z,&local_190,(ON_3dVector *)&z.z);
    ON_3dPoint::operator-((ON_3dPoint *)&p[5].z,(ON_3dPoint *)this,(ON_3dVector *)&z.z);
    ON_3dPoint::operator+((ON_3dPoint *)&w,(ON_3dPoint *)this,(ON_3dVector *)&y.z);
    ON_3dPoint::operator-((ON_3dPoint *)&p[6].z,(ON_3dPoint *)&w,(ON_3dVector *)&z.z);
    ON_3dPoint::operator+((ON_3dPoint *)&p[7].z,(ON_3dPoint *)this,(ON_3dVector *)&y.z);
    dVar5 = sqrt(2.0);
    dVar5 = 1.0 / dVar5;
    ON_3dPoint::operator-((ON_3dPoint *)&northpole.w,(ON_3dPoint *)this,(ON_3dVector *)&p[8].z);
    ON_4dPoint::ON_4dPoint((ON_4dPoint *)local_1e0,(ON_3dPoint *)&northpole.w);
    ON_3dPoint::operator+(&local_230,(ON_3dPoint *)this,(ON_3dVector *)&p[8].z);
    ON_4dPoint::ON_4dPoint((ON_4dPoint *)local_218,&local_230);
    for (southpole.w._4_4_ = 0; southpole.w._4_4_ < 8; southpole.w._4_4_ = southpole.w._4_4_ + 1) {
      pdVar3 = pdVar1 + (long)(southpole.w._4_4_ * 5) * 4;
      *pdVar3 = (double)local_1e0;
      pdVar3[1] = southpole.x;
      pdVar3[2] = southpole.y;
      pdVar3[3] = southpole.z;
      ON_3dPoint::operator-
                (&local_248,(ON_3dPoint *)&p[(long)southpole.w._4_4_ + -1].z,(ON_3dVector *)&p[8].z)
      ;
      ON_4dPoint::operator=
                ((ON_4dPoint *)(pdVar1 + (long)(southpole.w._4_4_ * 5 + 1) * 4),&local_248);
      ON_4dPoint::operator=
                ((ON_4dPoint *)(pdVar1 + (long)(southpole.w._4_4_ * 5 + 2) * 4),
                 (ON_3dPoint *)&p[(long)southpole.w._4_4_ + -1].z);
      ON_3dPoint::operator+
                (&local_260,(ON_3dPoint *)&p[(long)southpole.w._4_4_ + -1].z,(ON_3dVector *)&p[8].z)
      ;
      ON_4dPoint::operator=
                ((ON_4dPoint *)(pdVar1 + (long)(southpole.w._4_4_ * 5 + 3) * 4),&local_260);
      pdVar3 = pdVar1 + (long)(southpole.w._4_4_ * 5 + 4) * 4;
      *pdVar3 = (double)local_218;
      pdVar3[1] = northpole.x;
      pdVar3[2] = northpole.y;
      pdVar3[3] = northpole.z;
      dStack_1b8 = dVar5;
      if (southpole.w._4_4_ % 2 != 0) {
        pdVar1[(long)(southpole.w._4_4_ * 5) * 4] =
             dVar5 * pdVar1[(long)(southpole.w._4_4_ * 5) * 4];
        pdVar1[(long)(southpole.w._4_4_ * 5) * 4 + 1] =
             dVar5 * pdVar1[(long)(southpole.w._4_4_ * 5) * 4 + 1];
        pdVar1[(long)(southpole.w._4_4_ * 5) * 4 + 2] =
             dVar5 * pdVar1[(long)(southpole.w._4_4_ * 5) * 4 + 2];
        pdVar1[(long)(southpole.w._4_4_ * 5) * 4 + 3] = dVar5;
        pdVar1[(long)(southpole.w._4_4_ * 5 + 2) * 4] =
             dVar5 * pdVar1[(long)(southpole.w._4_4_ * 5 + 2) * 4];
        iVar4 = southpole.w._4_4_ * 5 + 2;
        pdVar1[(long)iVar4 * 4 + 1] = dVar5 * pdVar1[(long)iVar4 * 4 + 1];
        iVar4 = southpole.w._4_4_ * 5 + 2;
        pdVar1[(long)iVar4 * 4 + 2] = dVar5 * pdVar1[(long)iVar4 * 4 + 2];
        pdVar1[(long)(southpole.w._4_4_ * 5 + 2) * 4 + 3] = dVar5;
        pdVar1[(long)(southpole.w._4_4_ * 5 + 4) * 4] =
             dVar5 * pdVar1[(long)(southpole.w._4_4_ * 5 + 4) * 4];
        iVar4 = southpole.w._4_4_ * 5 + 4;
        pdVar1[(long)iVar4 * 4 + 1] = dVar5 * pdVar1[(long)iVar4 * 4 + 1];
        iVar4 = southpole.w._4_4_ * 5 + 4;
        pdVar1[(long)iVar4 * 4 + 2] = dVar5 * pdVar1[(long)iVar4 * 4 + 2];
        pdVar1[(long)(southpole.w._4_4_ * 5 + 4) * 4 + 3] = dVar5;
        dStack_1b8 = 0.5;
      }
      pdVar1[(long)(southpole.w._4_4_ * 5 + 1) * 4] =
           dStack_1b8 * pdVar1[(long)(southpole.w._4_4_ * 5 + 1) * 4];
      iVar4 = southpole.w._4_4_ * 5 + 1;
      pdVar1[(long)iVar4 * 4 + 1] = dStack_1b8 * pdVar1[(long)iVar4 * 4 + 1];
      iVar4 = southpole.w._4_4_ * 5 + 1;
      pdVar1[(long)iVar4 * 4 + 2] = dStack_1b8 * pdVar1[(long)iVar4 * 4 + 2];
      pdVar1[(long)(southpole.w._4_4_ * 5 + 1) * 4 + 3] = dStack_1b8;
      pdVar1[(long)(southpole.w._4_4_ * 5 + 3) * 4] =
           dStack_1b8 * pdVar1[(long)(southpole.w._4_4_ * 5 + 3) * 4];
      iVar4 = southpole.w._4_4_ * 5 + 3;
      pdVar1[(long)iVar4 * 4 + 1] = dStack_1b8 * pdVar1[(long)iVar4 * 4 + 1];
      iVar4 = southpole.w._4_4_ * 5 + 3;
      pdVar1[(long)iVar4 * 4 + 2] = dStack_1b8 * pdVar1[(long)iVar4 * 4 + 2];
      pdVar1[(long)(southpole.w._4_4_ * 5 + 3) * 4 + 3] = dStack_1b8;
    }
    pdVar1[0xa0] = *pdVar1;
    pdVar1[0xa1] = pdVar1[1];
    pdVar1[0xa2] = pdVar1[2];
    pdVar1[0xa3] = pdVar1[3];
    pdVar1[0xa4] = pdVar1[4];
    pdVar1[0xa5] = pdVar1[5];
    pdVar1[0xa6] = pdVar1[6];
    pdVar1[0xa7] = pdVar1[7];
    pdVar1[0xa8] = pdVar1[8];
    pdVar1[0xa9] = pdVar1[9];
    pdVar1[0xaa] = pdVar1[10];
    pdVar1[0xab] = pdVar1[0xb];
    pdVar1[0xac] = pdVar1[0xc];
    pdVar1[0xad] = pdVar1[0xd];
    pdVar1[0xae] = pdVar1[0xe];
    pdVar1[0xaf] = pdVar1[0xf];
    pdVar1[0xb0] = pdVar1[0x10];
    pdVar1[0xb1] = pdVar1[0x11];
    pdVar1[0xb2] = pdVar1[0x12];
    pdVar1[0xb3] = pdVar1[0x13];
    CV._4_4_ = 2;
  }
  return CV._4_4_;
}

Assistant:

int ON_Sphere::GetNurbForm( ON_NurbsSurface& s ) const
{
  int rc = 0;
  if ( IsValid() ) {
    s.Create(3,true,3,3,9,5);
    s.m_knot[0][0] = s.m_knot[0][1] = 0.0;
    s.m_knot[0][2] = s.m_knot[0][3] = 0.5*ON_PI;
    s.m_knot[0][4] = s.m_knot[0][5] = ON_PI;
    s.m_knot[0][6] = s.m_knot[0][7] = 1.5*ON_PI;
    s.m_knot[0][8] = s.m_knot[0][9] = 2.0*ON_PI;

    s.m_knot[1][0] = s.m_knot[1][1] = -0.5*ON_PI;
    s.m_knot[1][2] = s.m_knot[1][3] = 0.0;
    s.m_knot[1][4] = s.m_knot[1][5] = 0.5*ON_PI;

    ON_4dPoint* CV = (ON_4dPoint*)s.m_cv;
    const ON_3dVector x = radius*plane.xaxis;
    const ON_3dVector y = radius*plane.yaxis;
    const ON_3dVector z = radius*plane.zaxis;

    ON_3dPoint p[9] = {plane.origin+x,
                       plane.origin+x+y,
                       plane.origin+y,
                       plane.origin-x+y,
                       plane.origin-x,
                       plane.origin-x-y,
                       plane.origin-y,
                       plane.origin+x-y,
                       plane.origin+x};

    const double w = 1.0/sqrt(2.0);
    double w13;
    int i;
    ON_4dPoint southpole = plane.origin - z;
    ON_4dPoint northpole = plane.origin + z;
    for ( i = 0; i < 8; i++ ) {
      CV[5*i  ] = southpole;
      CV[5*i+1] = p[i] - z;
      CV[5*i+2] = p[i];
      CV[5*i+3] = p[i] + z;
      CV[5*i+4] = northpole;

      if ( i%2) {
        CV[5*i  ].x *= w;
        CV[5*i  ].y *= w;
        CV[5*i  ].z *= w;
        CV[5*i  ].w = w;
        CV[5*i+2].x *= w;
        CV[5*i+2].y *= w;
        CV[5*i+2].z *= w;
        CV[5*i+2].w = w;
        CV[5*i+4].x *= w;
        CV[5*i+4].y *= w;
        CV[5*i+4].z *= w;
        CV[5*i+4].w = w;
        w13 = 0.5;
      }
      else {
        w13 = w;
      }
      CV[5*i+1].x *= w13;
      CV[5*i+1].y *= w13;
      CV[5*i+1].z *= w13;
      CV[5*i+1].w  = w13;

      CV[5*i+3].x *= w13;
      CV[5*i+3].y *= w13;
      CV[5*i+3].z *= w13;
      CV[5*i+3].w  = w13;
    }
    CV[40] = CV[0];
    CV[41] = CV[1];
    CV[42] = CV[2];
    CV[43] = CV[3];
    CV[44] = CV[4];
    rc = 2;
  }
  return rc;
}